

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

int __thiscall HModel::util_chgColBoundsAll(HModel *this,double *XcolLower,double *XcolUpper)

{
  int iVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  
  iVar1 = this->numCol;
  if (0 < (long)iVar1) {
    pdVar2 = (this->colScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = 0;
    do {
      dVar7 = XcolLower[lVar5];
      if (1e+200 <= dVar7) {
        return (uint)lVar5 + 1;
      }
      dVar6 = XcolUpper[lVar5];
      if (dVar6 <= -1e+200) {
        return ~(uint)lVar5;
      }
      if (-1e+200 < dVar7) {
        dVar7 = dVar7 / pdVar2[lVar5];
      }
      pdVar3[lVar5] = dVar7;
      if (dVar6 < 1e+200) {
        dVar6 = dVar6 / pdVar2[lVar5];
      }
      pdVar4[lVar5] = dVar6;
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  mlFg_Update(this,this->mlFg_action_NewBounds);
  return 0;
}

Assistant:

int HModel::util_chgColBoundsAll(const double* XcolLower, const double* XcolUpper) {
  assert(XcolLower != NULL);
  assert(XcolUpper != NULL);
  for (int col = 0; col < numCol; ++col) {
    double lower = XcolLower[col];
    double upper = XcolUpper[col];
    //Check that the lower bound is not being set to +Inf
    if (hsol_isInfinity(lower)) return col+1;
    //Check that the lower bound is not being set to +Inf
    if (hsol_isInfinity(-upper)) return -(col+1);
    assert(lower<=upper);
    colLower[col] = (hsol_isInfinity(-lower) ? lower : lower / colScale[col]);
    colUpper[col] = (hsol_isInfinity( upper) ? upper : upper / colScale[col]);
    //    printf("[LB; Pr; UB] for column %2d are now [%11g, %11g, %11g] Dual = %g\n", col, colLower[col], workValue[col], colUpper[col], workDual[col]);
  }
  //Deduce the consequences of new bounds
  mlFg_Update(mlFg_action_NewBounds);
  return 0;
}